

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::AddKel(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
         *this,TPZFMatrix<std::complex<long_double>_> *elmat,TPZVec<long> *sourceindex,
        TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  int64_t GlobalSize;
  TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  *in_RDI;
  TPZEqnArray<std::complex<long_double>_> AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffff6f40;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffff6f48;
  int64_t *in_stack_ffffffffffff6f58;
  TPZFrontSym<std::complex<long_double>_> *in_stack_ffffffffffff6f60;
  TPZVec<long> *in_stack_ffffffffffff6f68;
  TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  *in_stack_ffffffffffff6f70;
  TPZVec<long> *in_stack_ffffffffffff6f78;
  TPZVec<long> *in_stack_ffffffffffff6f80;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffff6f88;
  TPZFrontSym<std::complex<long_double>_> *in_stack_ffffffffffff6f90;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffffffb8;
  TPZStackEqnStorage<std::complex<long_double>_> *in_stack_ffffffffffffffc0;
  TPZEqnArray<std::complex<long_double>_> *local_30;
  long local_28;
  
  TPZFrontSym<std::complex<long_double>_>::AddKel
            (in_stack_ffffffffffff6f90,in_stack_ffffffffffff6f88,in_stack_ffffffffffff6f80,
             in_stack_ffffffffffff6f78);
  EquationsToDecompose
            (in_stack_ffffffffffff6f70,in_stack_ffffffffffff6f68,
             (int64_t *)in_stack_ffffffffffff6f60,in_stack_ffffffffffff6f58);
  TPZEqnArray<std::complex<long_double>_>::TPZEqnArray
            ((TPZEqnArray<std::complex<long_double>_> *)in_stack_ffffffffffff6f70);
  if (local_28 <= (long)local_30) {
    TPZFrontSym<std::complex<long_double>_>::DecomposeEquations
              (in_stack_ffffffffffff6f60,(int64_t)in_stack_ffffffffffff6f58,(int64_t)in_RDI,
               in_stack_ffffffffffff6f48);
    CheckCompress(in_RDI);
    TPZStackEqnStorage<std::complex<long_double>_>::AddEqnArray
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    GlobalSize = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    in_stack_ffffffffffff6f40 = local_30;
    if (local_30 == (TPZEqnArray<std::complex<long_double>_> *)(GlobalSize + -1)) {
      TPZFrontSym<std::complex<long_double>_>::Reset
                ((TPZFrontSym<std::complex<long_double>_> *)in_RDI,GlobalSize);
      TPZStackEqnStorage<std::complex<long_double>_>::FinishWriting(&in_RDI->fStorage);
      TPZStackEqnStorage<std::complex<long_double>_>::ReOpen(&in_RDI->fStorage);
      in_stack_ffffffffffff6f40 = local_30;
    }
  }
  DVar1 = TPZFrontSym<std::complex<long_double>_>::GetDecomposeType(&in_RDI->fFront);
  (in_RDI->super_TPZAbstractFrontMatrix<std::complex<long_double>_>).
  super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fDecomposed = (char)DVar1;
  TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray(in_stack_ffffffffffff6f40);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fFront.Reset(0);
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}